

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_infinity(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong __n;
  undefined1 *__buf;
  void *__s1;
  void *__s2;
  undefined8 extraout_RAX;
  long *plVar6;
  long lVar7;
  undefined8 extraout_RAX_00;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *unaff_RBX;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  undefined **ppuVar15;
  undefined **ppuVar16;
  undefined **__needle;
  double d;
  bson_t b;
  bson_error_t error;
  code **ppcVar17;
  undefined4 uStack_165c;
  undefined8 uStack_1658;
  undefined2 uStack_1650;
  int iStack_1648;
  int iStack_1644;
  char acStack_1640 [504];
  code *pcStack_1448;
  undefined1 auStack_1438 [512];
  char *pcStack_1238;
  code *pcStack_1230;
  int iStack_1220;
  int iStack_121c;
  char acStack_1218 [504];
  long *plStack_1020;
  char *pcStack_1018;
  char *pcStack_1010;
  undefined **ppuStack_1008;
  long lStack_f90;
  long lStack_f88;
  undefined1 auStack_f80 [128];
  undefined1 auStack_f00 [232];
  undefined1 auStack_e18 [608];
  long *plStack_bb8;
  code *pcStack_bb0;
  undefined1 auStack_ba8 [8];
  char acStack_ba0 [16];
  char *pcStack_b90;
  code *pcStack_b88;
  uint uStack_b04;
  undefined8 uStack_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 uStack_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 auStack_a38 [648];
  char *pcStack_7b0;
  char *pcStack_7a8;
  undefined **ppuStack_7a0;
  undefined1 *puStack_798;
  undefined **ppuStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [240];
  undefined1 auStack_690 [648];
  code *apcStack_408 [16];
  undefined *local_388;
  undefined1 local_380 [200];
  undefined8 local_2b8;
  char local_2b0 [640];
  
  pcVar11 = "{ \"d\": Infinity }";
  __needle = &PTR_anon_var_dwarf_1b023_001633b8;
  do {
    apcStack_408[0] = (code *)0x133bb4;
    cVar1 = bson_init_from_json(local_380,pcVar11,0xffffffffffffffff,&local_2b8);
    if (cVar1 == '\0') {
      apcStack_408[0] = (code *)0x133dd5;
      test_bson_json_infinity_cold_1();
LAB_00133dd5:
      apcStack_408[0] = (code *)0x133dda;
      test_bson_json_infinity_cold_2();
LAB_00133dda:
      apcStack_408[0] = (code *)0x133ddf;
      test_bson_json_infinity_cold_3();
      goto LAB_00133ddf;
    }
    apcStack_408[0] = (code *)0x133bc1;
    unaff_RBX = (char *)bson_bcone_magic();
    apcStack_408[0] = (code *)0x133bdf;
    cVar1 = bcon_extract(local_380,"d",unaff_RBX,1,&local_388,0);
    if (cVar1 == '\0') goto LAB_00133dd5;
    if (NAN((double)local_388)) goto LAB_00133dda;
    if (!NAN((double)local_388 - (double)local_388) && !NAN((double)local_388 - (double)local_388))
    goto LAB_00133dda;
    apcStack_408[0] = (code *)0x133c0d;
    bson_destroy(local_380);
    pcVar11 = *__needle;
    __needle = __needle + 1;
  } while (pcVar11 != (char *)0x0);
  pcVar11 = "{ \"d\": -Infinity }";
  __needle = &PTR_anon_var_dwarf_1b047_001633d8;
  do {
    apcStack_408[0] = (code *)0x133c52;
    cVar1 = bson_init_from_json(local_380,pcVar11,0xffffffffffffffff,&local_2b8);
    if (cVar1 == '\0') goto LAB_00133ddf;
    apcStack_408[0] = (code *)0x133c75;
    cVar1 = bcon_extract(local_380,"d",unaff_RBX,1,&local_388,0);
    if (cVar1 == '\0') goto LAB_00133de4;
    if ((NAN((double)local_388)) || (!NAN((double)local_388 - (double)local_388)))
    goto LAB_00133de9;
    if (0.0 <= (double)local_388) goto LAB_00133dee;
    apcStack_408[0] = (code *)0x133cb5;
    bson_destroy(local_380);
    pcVar11 = *__needle;
    __needle = __needle + 1;
  } while (pcVar11 != (char *)0x0);
  pcVar12 = "{ \"d\": Infinityy }";
  ppuVar16 = &PTR_anon_var_dwarf_1b06b_001633f8;
  unaff_RBX = local_2b0;
  __needle = (undefined **)&local_2b8;
  pcVar11 = "Got parse error at";
  do {
    apcStack_408[0] = (code *)0x133d04;
    cVar1 = bson_init_from_json(local_380,pcVar12,0xffffffffffffffff,__needle);
    if (cVar1 != '\0') goto LAB_00133df3;
    if ((int)local_2b8 != 1) goto LAB_00133e0a;
    if (local_2b8._4_4_ != 1) goto LAB_00133dfd;
    apcStack_408[0] = (code *)0x133d37;
    pcVar12 = strstr(unaff_RBX,"Got parse error at");
    if (pcVar12 == (char *)0x0) goto LAB_00133e02;
    pcVar12 = *ppuVar16;
    ppuVar16 = ppuVar16 + 1;
  } while (pcVar12 != (char *)0x0);
  pcVar12 = "{ \"d\": In";
  ppuVar16 = &PTR_anon_var_dwarf_1b0cb_00163448;
  __needle = (undefined **)&local_2b8;
  pcVar11 = "Incomplete JSON";
  while( true ) {
    apcStack_408[0] = (code *)0x133d84;
    cVar1 = bson_init_from_json(local_380,pcVar12,0xffffffffffffffff,__needle);
    if (cVar1 != '\0') break;
    if ((int)local_2b8 != 1) goto LAB_00133e1c;
    if (local_2b8._4_4_ != 1) goto LAB_00133e0f;
    apcStack_408[0] = (code *)0x133daf;
    pcVar12 = strstr(unaff_RBX,"Incomplete JSON");
    if (pcVar12 == (char *)0x0) goto LAB_00133e14;
    pcVar12 = *ppuVar16;
    ppuVar16 = ppuVar16 + 1;
    if (pcVar12 == (char *)0x0) {
      return;
    }
  }
LAB_00133df8:
  apcStack_408[0] = (code *)0x133dfd;
  test_bson_json_infinity_cold_13();
LAB_00133dfd:
  apcStack_408[0] = (code *)0x133e02;
  test_bson_json_infinity_cold_9();
LAB_00133e02:
  apcStack_408[0] = (code *)0x133e0a;
  test_bson_json_infinity_cold_14();
LAB_00133e0a:
  apcStack_408[0] = (code *)0x133e0f;
  test_bson_json_infinity_cold_8();
LAB_00133e0f:
  apcStack_408[0] = (code *)0x133e14;
  test_bson_json_infinity_cold_11();
LAB_00133e14:
  apcStack_408[0] = (code *)0x133e1c;
  test_bson_json_infinity_cold_12();
LAB_00133e1c:
  __buf = local_380;
  apcStack_408[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_788 = (code *)0x133e4e;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_init_from_json(auStack_780,"{ \"x\": null }",0xffffffffffffffff,auStack_690);
  if (cVar1 == '\0') {
    pcStack_788 = (code *)0x133e89;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_788 = (code *)0x133e57;
    uVar5 = bson_bcone_magic();
    pcStack_788 = (code *)0x133e73;
    cVar1 = bcon_extract(auStack_780,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_788 = (code *)0x133e7f;
      bson_destroy(auStack_780);
      return;
    }
  }
  pcStack_788 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_b88 = (code *)0x0;
  pcStack_b90 = "}";
  acStack_ba0[8] = -0x2e;
  acStack_ba0[9] = '>';
  acStack_ba0[10] = '\x13';
  acStack_ba0[0xb] = '\0';
  acStack_ba0[0xc] = '\0';
  acStack_ba0[0xd] = '\0';
  acStack_ba0[0xe] = '\0';
  acStack_ba0[0xf] = '\0';
  pcStack_7b0 = unaff_RBX;
  pcStack_7a8 = pcVar11;
  ppuStack_7a0 = ppuVar16;
  puStack_798 = __buf;
  ppuStack_790 = __needle;
  pcStack_788 = (code *)apcStack_408;
  __n = bcon_new(0,"a","{","b","{");
  uStack_a90 = 0;
  uStack_a88 = 0;
  uStack_aa0 = 0;
  uStack_a98 = 0;
  uStack_ab0 = 0;
  uStack_aa8 = 0;
  uStack_ac0 = 0;
  uStack_ab8 = 0;
  uStack_ad0 = 0;
  uStack_ac8 = 0;
  uStack_ae0 = 0;
  uStack_ad8 = 0;
  uStack_af0 = 0;
  uStack_ae8 = 0;
  uStack_b00 = (undefined *)0x500000003;
  uStack_af8 = 5;
  pcStack_b88 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&uStack_b00,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_a38);
  if (cVar1 != '\0') {
    pcStack_b88 = (code *)0x133f47;
    __needle = (undefined **)bson_get_data(&uStack_b00);
    pcStack_b88 = (code *)0x133f52;
    __buf = (undefined1 *)bson_get_data(__n);
    if (*(int *)(__n + 4) == uStack_b00._4_4_) {
      pcStack_b88 = (code *)0x133f67;
      __s1 = (void *)bson_get_data(__n);
      pcStack_b88 = (code *)0x133f77;
      __s2 = (void *)bson_get_data(&uStack_b00);
      pcStack_b88 = (code *)0x133f85;
      iVar2 = bcmp(__s1,__s2,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        pcStack_b88 = (code *)0x133f96;
        bson_destroy(&uStack_b00);
        pcStack_b88 = (code *)0x133f9e;
        bson_destroy(__n);
        return;
      }
    }
    ppuVar16 = (undefined **)&uStack_b00;
    pcStack_b88 = (code *)0x133fbf;
    pcVar11 = (char *)bson_as_canonical_extended_json(ppuVar16);
    pcStack_b88 = (code *)0x133fcc;
    uVar5 = bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n + 4);
    if (uStack_b00._4_4_ != 0) {
      uVar13 = 0;
      do {
        if (uVar3 == (uint)uVar13) break;
        if (*(char *)((long)__needle + uVar13) != __buf[uVar13]) goto LAB_0013409c;
        uVar13 = uVar13 + 1;
      } while (uStack_b00._4_4_ != (uint)uVar13);
    }
    uVar4 = uStack_b00._4_4_;
    if (uStack_b00._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar13 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_b88 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar13,pcVar11,uVar5);
      pcStack_b88 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      pcVar11 = (char *)(ulong)uVar3;
      pcStack_b88 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_b04 = uVar3;
      if (uVar3 == 0xffffffff) break;
      ppuVar16 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      pcVar11 = (char *)((ulong)uStack_b00 >> 0x20);
      pcStack_b88 = (code *)0x134075;
      pcVar12 = (char *)write(uVar3,__needle,(size_t)pcVar11);
      if (pcVar12 != pcVar11) goto LAB_001340ad;
      __n = (ulong)*(uint *)(__n + 4);
      pcStack_b88 = (code *)0x13408b;
      uVar13 = write(uVar4,__buf,__n);
      if (uVar13 != __n) goto LAB_001340b2;
      uVar13 = (ulong)uVar4;
      pcStack_b88 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar5 = extraout_RAX;
LAB_0013409c:
      uVar13 = uVar13 & 0xffffffff;
    }
    pcStack_b88 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_b88 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_b88 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_b88 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_b88 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar12 = acStack_ba0;
  acStack_ba0[8] = '\0';
  acStack_ba0[9] = '\0';
  acStack_ba0[10] = '\0';
  acStack_ba0[0xb] = '\0';
  acStack_ba0[0xc] = '\0';
  acStack_ba0[0xd] = '\0';
  acStack_ba0[0xe] = '@';
  acStack_ba0[0xf] = '0';
  acStack_ba0[0] = '\v';
  acStack_ba0[1] = '\0';
  acStack_ba0[2] = '\0';
  acStack_ba0[3] = '\0';
  acStack_ba0[4] = '\0';
  acStack_ba0[5] = '\0';
  acStack_ba0[6] = '\0';
  acStack_ba0[7] = '\0';
  pcStack_bb0 = (code *)0x1340ea;
  pcStack_b90 = (char *)__n;
  pcStack_b88 = (code *)__buf;
  plVar6 = (long *)bson_new();
  pcStack_bb0 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar6,"decimal128",0xffffffff,pcVar12);
  if (cVar1 == '\0') {
    pcStack_bb0 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_bb0 = (code *)0x134113;
    pcVar12 = (char *)bson_as_json(plVar6,auStack_ba8);
    if (pcVar12 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_bb0 = (code *)0x13413d;
      bson_free(pcVar12);
      pcStack_bb0 = (code *)0x134145;
      bson_destroy(plVar6);
      return;
    }
    pcStack_bb0 = (code *)0x134131;
    iVar2 = strcmp(pcVar12,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_bb0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar17 = &pcStack_bb0;
  ppuStack_1008 = (undefined **)0x13418d;
  plStack_bb8 = plVar6;
  pcStack_bb0 = (code *)&pcStack_788;
  cVar1 = bson_init_from_json(auStack_f00,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_e18);
  if (cVar1 == '\0') goto LAB_00134231;
  ppuStack_1008 = (undefined **)0x1341aa;
  cVar1 = bson_iter_init(auStack_f80,auStack_f00);
  if (cVar1 == '\0') {
    ppuStack_1008 = (undefined **)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    ppuStack_1008 = (undefined **)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    ppuStack_1008 = (undefined **)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    ppuStack_1008 = (undefined **)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    ppuStack_1008 = (undefined **)0x1341c2;
    cVar1 = bson_iter_find(auStack_f80,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    ppuStack_1008 = (undefined **)0x1341d3;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar6 = &lStack_f90;
    ppuStack_1008 = (undefined **)0x1341ed;
    bson_iter_decimal128(auStack_f80,plVar6);
    if (lStack_f90 != 0xb) goto LAB_00134227;
    if (lStack_f88 == 0x3040000000000000) {
      ppuStack_1008 = (undefined **)0x134211;
      bson_destroy(auStack_f00);
      return;
    }
  }
  ppuStack_1008 = (undefined **)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  ppuStack_1008 = (undefined **)test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar14 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar15 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_1020 = plVar6;
  pcStack_1018 = pcVar11;
  pcStack_1010 = pcVar12;
  ppuStack_1008 = __needle;
  do {
    pcStack_1230 = (code *)0x134273;
    lVar7 = bson_new_from_json(pcVar14,0xffffffffffffffff,&iStack_1220);
    if (lVar7 != 0) {
      pcStack_1230 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_1230 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_1218,
              __needle);
      pcStack_1230 = (code *)0x1342e3;
      abort();
    }
    if (iStack_1220 != 1) {
LAB_001342e8:
      pcStack_1230 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_1448 = (code *)0x13430d;
      pcStack_1238 = acStack_1218;
      pcStack_1230 = (code *)&iStack_1220;
      pcVar11 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_1438);
      pcStack_1448 = (code *)0x13431a;
      pcVar12 = (char *)bson_as_json(pcVar11,0);
      if (pcVar12 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_1448 = (code *)0x134344;
        bson_free(pcVar12);
        pcStack_1448 = (code *)0x13434c;
        bson_destroy(pcVar11);
        return;
      }
      pcStack_1448 = (code *)0x134338;
      iVar2 = strcmp(pcVar12,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_1448 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_1658 = 0x2200223a2261227b;
      uStack_1650 = 0x7d;
      uStack_165c = 0x227b;
      pcStack_1448 = (code *)pcVar11;
      lVar7 = bson_new_from_json(&uStack_1658,9,&iStack_1648);
      if (lVar7 == 0) {
        if (iStack_1648 != 1) goto LAB_00134418;
        if (iStack_1644 != 1) goto LAB_0013441d;
        pcVar11 = acStack_1640;
        pcVar14 = strstr(pcVar11,"Got parse error");
        if (pcVar14 == (char *)0x0) goto LAB_00134422;
        lVar7 = bson_new_from_json(&uStack_165c,3,&iStack_1648);
        if (lVar7 != 0) goto LAB_00134413;
        if (iStack_1648 != 1) goto LAB_0013442a;
        if (iStack_1644 == 1) {
          pcVar14 = strstr(pcVar11,"Got parse error");
          if (pcVar14 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX_00;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar8 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0,uVar5,pcVar11,ppuVar15,ppuVar16,pcVar12,__needle,ppcVar17
                      );
      uVar9 = bcon_new(0,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar9,0);
      uVar5 = bson_new();
      uVar9 = bson_new();
      uVar10 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar9,uVar10,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar8,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_121c != 2) {
      pcStack_1230 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    __needle = (undefined **)ppuVar15[-1];
    pcStack_1230 = (code *)0x13429a;
    pcVar11 = strstr(acStack_1218,(char *)__needle);
    if (pcVar11 == (char *)0x0) goto LAB_001342c0;
    pcVar14 = *ppuVar15;
    ppuVar15 = ppuVar15 + 2;
    if (pcVar14 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00133ddf:
  apcStack_408[0] = (code *)0x133de4;
  test_bson_json_infinity_cold_4();
LAB_00133de4:
  apcStack_408[0] = (code *)0x133de9;
  test_bson_json_infinity_cold_5();
LAB_00133de9:
  apcStack_408[0] = (code *)0x133dee;
  test_bson_json_infinity_cold_6();
LAB_00133dee:
  ppuVar16 = &local_388;
  pcVar11 = "d";
  apcStack_408[0] = (code *)0x133df3;
  test_bson_json_infinity_cold_7();
LAB_00133df3:
  apcStack_408[0] = (code *)0x133df8;
  test_bson_json_infinity_cold_15();
  goto LAB_00133df8;
}

Assistant:

static void
test_bson_json_infinity (void)
{
   bson_error_t error;
   bson_t b;
   double d;

   /* should parse any capitalization of Infinity */
   const char *infs[] = {"{ \"d\": Infinity }",
                         "{ \"d\": infinity }",
                         "{ \"d\": inFINIty }",
                         NULL};

   const char *negs[] = {"{ \"d\": -Infinity }",
                         "{ \"d\": -infinity }",
                         "{ \"d\": -inFINIty }",
                         NULL};

   const char *bad[] = {"{ \"d\": Infinityy }",
                        "{ \"d\": Infinit }",
                        "{ \"d\": -Infinityy }",
                        "{ \"d\": -Infinit }",
                        "{ \"d\": infinityy }",
                        "{ \"d\": infinit }",
                        "{ \"d\": -infinityy }",
                        "{ \"d\": -infinit }",
                        NULL};

   const char *partial[] = {"{ \"d\": In", "{ \"d\": I", "{ \"d\": i", NULL};
   const char **j;

   for (j = infs; *j; j++) {
      BSON_ASSERT (bson_init_from_json (&b, *j, -1, &error));
      BSON_ASSERT (BCON_EXTRACT (&b, "d", BCONE_DOUBLE (d)));
      /* Infinite */
      BSON_ASSERT (d == d && ((d - d) != (d - d)));
      bson_destroy (&b);
   }

   for (j = negs; *j; j++) {
      BSON_ASSERT (bson_init_from_json (&b, *j, -1, &error));
      BSON_ASSERT (BCON_EXTRACT (&b, "d", BCONE_DOUBLE (d)));
      /* Infinite */
      BSON_ASSERT (d == d && ((d - d) != (d - d)));
      BSON_ASSERT (d < 0);
      bson_destroy (&b);
   }

   for (j = bad; *j; j++) {
      BSON_ASSERT (!bson_init_from_json (&b, *j, -1, &error));
      ASSERT_ERROR_CONTAINS (error,
                             BSON_ERROR_JSON,
                             BSON_JSON_ERROR_READ_CORRUPT_JS,
                             "Got parse error at");
   }

   for (j = partial; *j; j++) {
      BSON_ASSERT (!bson_init_from_json (&b, *j, -1, &error));
      ASSERT_ERROR_CONTAINS (error,
                             BSON_ERROR_JSON,
                             BSON_JSON_ERROR_READ_CORRUPT_JS,
                             "Incomplete JSON");
   }
}